

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

char * tinyfd_inputBox(char *aTitle,char *aMessage,char *aDefaultInput)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *__dest;
  FILE *__stream;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  undefined4 uVar10;
  size_t sStack_d0;
  termios oldt;
  termios newt;
  
  tinyfd_inputBox::lBuff[0] = '\0';
  if (aTitle == (char *)0x0) {
    lVar9 = 0x400;
  }
  else {
    sVar6 = strlen(aTitle);
    lVar9 = sVar6 + 0x400;
  }
  if (aMessage == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = strlen(aMessage);
  }
  if ((aTitle == (char *)0x0) || (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 != 0)) {
    __dest = (char *)malloc(sVar6 + lVar9);
  }
  else {
    __dest = (char *)0x0;
  }
  iVar4 = osascriptPresent();
  if (iVar4 == 0) {
    iVar4 = kdialogPresent();
    if (iVar4 == 0) {
      iVar4 = zenityPresent();
      if ((iVar4 != 0) || (iVar4 = matedialogPresent(), iVar4 != 0)) {
LAB_00112434:
        iVar4 = zenityPresent();
        if (iVar4 == 0) {
          iVar4 = matedialogPresent();
          if (iVar4 == 0) {
            if (shellementaryPresent_lShellementaryPresent == '\0') {
              shellementaryPresent_lShellementaryPresent = '\x01';
            }
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              builtin_strncpy(tinyfd_response,"qarma",6);
              return (char *)0x1;
            }
            builtin_strncpy(__dest,"szAnswer=$(qarma",0x11);
            pcVar7 = getenv("SSH_TTY");
            if (pcVar7 == (char *)0x0) {
              sVar6 = strlen(__dest);
              pcVar7 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
              sStack_d0 = 0x41;
              goto LAB_00112634;
            }
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              builtin_strncpy(tinyfd_response,"matedialog",0xb);
              return (char *)0x1;
            }
            builtin_strncpy(__dest,"szAnswer=$(matedialog",0x16);
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            builtin_strncpy(tinyfd_response,"zenity",7);
            return (char *)0x1;
          }
          builtin_strncpy(__dest,"szAnswer=$(zenity",0x12);
          iVar4 = zenity3Present();
          if ((3 < iVar4) && (pcVar7 = getenv("SSH_TTY"), pcVar7 == (char *)0x0)) {
            sVar6 = strlen(__dest);
            pcVar7 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)"
            ;
            sStack_d0 = 0x4b;
LAB_00112634:
            memcpy(__dest + sVar6,pcVar7,sStack_d0);
          }
        }
        sVar6 = strlen(__dest);
        builtin_strncpy(__dest + sVar6," --entry",9);
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6," --title=\"",0xb);
          strcat(__dest,aTitle);
          sVar6 = strlen(__dest);
          (__dest + sVar6)[0] = '\"';
          (__dest + sVar6)[1] = '\0';
        }
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6," --text=\"",10);
          strcat(__dest,aMessage);
          sVar6 = strlen(__dest);
          (__dest + sVar6)[0] = '\"';
          (__dest + sVar6)[1] = '\0';
        }
        if ((aDefaultInput == (char *)0x0) || (*aDefaultInput == '\0')) {
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6," --hide-text",0xd);
        }
        else {
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6," --entry-text=\"",0x10);
          strcat(__dest,aDefaultInput);
          sVar6 = strlen(__dest);
          (__dest + sVar6)[0] = '\"';
          (__dest + sVar6)[1] = '\0';
        }
        if (tinyfd_silent != 0) {
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6," 2>/dev/null ",0xe);
        }
        goto LAB_0011275b;
      }
      if (shellementaryPresent_lShellementaryPresent == '\0') {
        shellementaryPresent_lShellementaryPresent = '\x01';
      }
      iVar4 = qarmaPresent();
      if (iVar4 != 0) goto LAB_00112434;
      iVar4 = gxmessagePresent();
      if ((iVar4 == 0) && (iVar4 = gmessagePresent(), iVar4 == 0)) {
        iVar4 = gdialogPresent();
        if (((iVar4 == 0) && (iVar4 = xdialogPresent(), iVar4 == 0)) &&
           (iVar4 = tkinter2Present(), iVar4 != 0)) {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            uVar10._0_1_ = 'o';
            uVar10._1_1_ = 'n';
            uVar10._2_1_ = '2';
            uVar10._3_1_ = '-';
LAB_0011337d:
            tinyfd_response._4_2_ = (undefined2)uVar10;
            tinyfd_response[6] = SUB41(uVar10,2);
            tinyfd_response[7] = SUB41(uVar10,3);
            builtin_strncpy(tinyfd_response,"pyth",4);
            builtin_strncpy(tinyfd_response + 8,"tkinter",8);
            return (char *)0x1;
          }
          strcpy(__dest,gPython2Name);
          iVar4 = isTerminalRunning();
          if ((iVar4 == 0) && (iVar4 = isDarwin(), iVar4 != 0)) {
            sVar6 = strlen(__dest);
            builtin_strncpy(__dest + sVar6," -i",4);
          }
          sVar6 = strlen(__dest);
          memcpy(__dest + sVar6,
                 " -S -c \"import Tkinter,tkSimpleDialog;root=Tkinter.Tk();root.withdraw();",0x49);
          iVar4 = isDarwin();
          if (iVar4 != 0) {
            sVar6 = strlen(__dest);
            memcpy(__dest + sVar6,
                   "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                   ,0x78);
          }
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6,"res=tkSimpleDialog.askstring(",0x1e);
          if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
            sVar6 = strlen(__dest);
            builtin_strncpy(__dest + sVar6,"title=\'",8);
            strcat(__dest,aTitle);
            sVar6 = strlen(__dest);
            (__dest + sVar6)[0] = '\'';
            (__dest + sVar6)[1] = ',';
            __dest[sVar6 + 2] = '\0';
          }
          if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
            sVar6 = strlen(__dest);
            builtin_strncpy(__dest + sVar6,"prompt=\'",9);
            sVar6 = strlen(__dest);
            replaceSubStr(aMessage,"\n","\\n",__dest + sVar6);
            sVar6 = strlen(__dest);
            __dest[sVar6 + 2] = '\0';
            (__dest + sVar6)[0] = '\'';
            (__dest + sVar6)[1] = ',';
          }
          if (aDefaultInput == (char *)0x0) {
            sVar6 = strlen(__dest);
            builtin_strncpy(__dest + sVar6,"show=\'*\'",9);
          }
          else if (*aDefaultInput != '\0') {
            sVar6 = strlen(__dest);
            builtin_strncpy(__dest + sVar6,"initialvalue=\'",0xf);
            strcat(__dest,aDefaultInput);
            sVar6 = strlen(__dest);
            (__dest + sVar6)[0] = '\'';
            (__dest + sVar6)[1] = ',';
            __dest[sVar6 + 2] = '\0';
          }
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6,");\nif res is None :\n\tprint 0",0x1d);
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6,"\nelse :\n\tprint \'1\'+res\n\"",0x19);
        }
        else {
          iVar4 = gdialogPresent();
          if (((iVar4 == 0) && (iVar4 = xdialogPresent(), iVar4 == 0)) &&
             (iVar4 = tkinter3Present(), iVar4 != 0)) {
            if (aTitle == (char *)0x0) {
              strcpy(__dest,gPython3Name);
              sVar6 = strlen(__dest);
              memcpy(__dest + sVar6,
                     " -S -c \"import tkinter; from tkinter import simpledialog;root=tkinter.Tk();root.withdraw();"
                     ,0x5c);
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"res=simpledialog.askstring(",0x1c);
            }
            else {
              iVar4 = strcmp(aTitle,"tinyfd_query");
              if (iVar4 == 0) {
                uVar10._0_1_ = 'o';
                uVar10._1_1_ = 'n';
                uVar10._2_1_ = '3';
                uVar10._3_1_ = '-';
                goto LAB_0011337d;
              }
              strcpy(__dest,gPython3Name);
              sVar6 = strlen(__dest);
              memcpy(__dest + sVar6,
                     " -S -c \"import tkinter; from tkinter import simpledialog;root=tkinter.Tk();root.withdraw();"
                     ,0x5c);
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"res=simpledialog.askstring(",0x1c);
              if (*aTitle != '\0') {
                sVar6 = strlen(__dest);
                builtin_strncpy(__dest + sVar6,"title=\'",8);
                strcat(__dest,aTitle);
                sVar6 = strlen(__dest);
                (__dest + sVar6)[0] = '\'';
                (__dest + sVar6)[1] = ',';
                __dest[sVar6 + 2] = '\0';
              }
            }
            if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"prompt=\'",9);
              sVar6 = strlen(__dest);
              replaceSubStr(aMessage,"\n","\\n",__dest + sVar6);
              sVar6 = strlen(__dest);
              __dest[sVar6 + 2] = '\0';
              (__dest + sVar6)[0] = '\'';
              (__dest + sVar6)[1] = ',';
            }
            if (aDefaultInput == (char *)0x0) {
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"show=\'*\'",9);
            }
            else if (*aDefaultInput != '\0') {
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"initialvalue=\'",0xf);
              strcat(__dest,aDefaultInput);
              sVar6 = strlen(__dest);
              (__dest + sVar6)[0] = '\'';
              (__dest + sVar6)[1] = ',';
              __dest[sVar6 + 2] = '\0';
            }
            sVar6 = strlen(__dest);
            builtin_strncpy(__dest + sVar6,");\nif res is None :\n\tprint(0)",0x1e);
            sVar6 = strlen(__dest);
            builtin_strncpy(__dest + sVar6,"\nelse :\n\tprint(\'1\'+res)\n\"",0x1a);
          }
          else {
            iVar4 = gdialogPresent();
            if (((iVar4 == 0) && (iVar4 = xdialogPresent(), iVar4 == 0)) &&
               ((pcVar7 = dialogName(), pcVar7 == (char *)0x0 &&
                (iVar4 = whiptailPresent(), iVar4 == 0)))) {
              iVar4 = isTerminalRunning();
              if ((iVar4 != 0) || (pcVar7 = terminalName(), pcVar7 == (char *)0x0)) {
                if ((gWarningDisplayed == 0) &&
                   ((iVar4 = isTerminalRunning(), iVar4 == 0 &&
                    (pcVar7 = terminalName(), pcVar7 == (char *)0x0)))) {
                  gWarningDisplayed = 1;
                  tinyfd_messageBox("missing software! (we will try basic console input)",
                                    " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                                    ,"ok","warning",0);
                  if (aTitle == (char *)0x0) {
                    return (char *)0x0;
                  }
                  iVar4 = strcmp(aTitle,"tinyfd_query");
                  if (iVar4 == 0) {
                    builtin_strncpy(tinyfd_response,"no_solution",0xc);
                    return (char *)0x0;
                  }
                  return (char *)0x0;
                }
                if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0))
                {
                  builtin_strncpy(tinyfd_response,"basicinput",0xb);
                  return (char *)0x0;
                }
                if (tinyfd_forceConsole == 0 && gWarningDisplayed == 0) {
                  gWarningDisplayed = 1;
                  tinyfd_messageBox("missing software! (we will try basic console input)",
                                    " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                                    ,"ok","warning",0);
                }
                if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
                  printf("\n%s\n",aTitle);
                }
                if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                  printf("\n%s\n",aMessage);
                }
                printf("(esc+enter to cancel): ");
                fflush(_stdout);
                if (aDefaultInput == (char *)0x0) {
                  tcgetattr(0,(termios *)&oldt);
                  newt.c_iflag = oldt.c_iflag;
                  newt.c_oflag = oldt.c_oflag;
                  newt.c_line = oldt.c_line;
                  newt.c_cc[0] = oldt.c_cc[0];
                  newt.c_cc[1] = oldt.c_cc[1];
                  newt.c_cc[2] = oldt.c_cc[2];
                  newt.c_cc[3] = oldt.c_cc[3];
                  newt.c_cc[4] = oldt.c_cc[4];
                  newt.c_cc[5] = oldt.c_cc[5];
                  newt.c_cc[6] = oldt.c_cc[6];
                  newt.c_cc[7] = oldt.c_cc[7];
                  newt.c_cc[8] = oldt.c_cc[8];
                  newt.c_cc[9] = oldt.c_cc[9];
                  newt.c_cc[10] = oldt.c_cc[10];
                  newt.c_cc[0xb] = oldt.c_cc[0xb];
                  newt.c_cc[0xc] = oldt.c_cc[0xc];
                  newt.c_cc[0xd] = oldt.c_cc[0xd];
                  newt.c_cc[0xe] = oldt.c_cc[0xe];
                  newt.c_cc[0xf] = oldt.c_cc[0xf];
                  newt.c_cc[0x10] = oldt.c_cc[0x10];
                  newt.c_cc[0x11] = oldt.c_cc[0x11];
                  newt.c_cc[0x12] = oldt.c_cc[0x12];
                  newt.c_cc[0x13] = oldt.c_cc[0x13];
                  newt.c_cc[0x14] = oldt.c_cc[0x14];
                  newt.c_cc[0x15] = oldt.c_cc[0x15];
                  newt.c_cc[0x16] = oldt.c_cc[0x16];
                  newt.c_ispeed = oldt.c_ispeed;
                  newt.c_ospeed = oldt.c_ospeed;
                  newt._8_8_ = oldt._8_8_ & 0xfffffff7ffffffff;
                  tcsetattr(0,0,(termios *)&newt);
                }
                pcVar7 = fgets(tinyfd_inputBox::lBuff,0x400,_stdin);
                if ((tinyfd_inputBox::lBuff[0] != '\0' && pcVar7 != (char *)0x0) &&
                   ((tinyfd_inputBox::lBuff[0] != '\n' ||
                    ((pcVar7 = fgets(tinyfd_inputBox::lBuff,0x400,_stdin), pcVar7 != (char *)0x0 &&
                     (tinyfd_inputBox::lBuff[0] != '\0')))))) {
                  if (aDefaultInput == (char *)0x0) {
                    tcsetattr(0,0,(termios *)&oldt);
                    putchar(10);
                  }
                  putchar(10);
                  pcVar7 = strchr(tinyfd_inputBox::lBuff,0x1b);
                  if (pcVar7 == (char *)0x0) {
                    sVar6 = strlen(tinyfd_inputBox::lBuff);
                    if (gPythonName[sVar6 + 0xf] == '\n') {
                      gPythonName[sVar6 + 0xf] = '\0';
                    }
                    free(__dest);
                    return tinyfd_inputBox::lBuff;
                  }
                }
                goto LAB_001128e3;
              }
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                builtin_strncpy(tinyfd_response,"basicinput",0xb);
                return (char *)0x0;
              }
              pcVar7 = terminalName();
              strcpy(__dest,pcVar7);
              sVar6 = strlen(__dest);
              (__dest + sVar6)[0] = '\'';
              (__dest + sVar6)[1] = '\0';
              if (tinyfd_forceConsole == 0 && gWarningDisplayed == 0) {
                gWarningDisplayed = 1;
                tinyfd_messageBox("missing software! (we will try basic console input)",
                                  " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                                  ,"ok","warning",0);
              }
              if (((aTitle != (char *)0x0) && (*aTitle != '\0')) && (tinyfd_forceConsole == 0)) {
                sVar6 = strlen(__dest);
                builtin_strncpy(__dest + sVar6,"echo \"",7);
                strcat(__dest,aTitle);
                sVar6 = strlen(__dest);
                builtin_strncpy(__dest + sVar6,"\";echo;",8);
              }
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"echo \"",7);
              if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                strcat(__dest,aMessage);
              }
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"\";read ",8);
              if (aDefaultInput == (char *)0x0) {
                sVar6 = strlen(__dest);
                builtin_strncpy(__dest + sVar6,"-s ",4);
              }
              sVar6 = strlen(__dest);
              bVar1 = false;
              builtin_strncpy(__dest + sVar6,"-p \"",5);
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"(esc+enter to cancel): \" ANSWER ",0x21);
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,";echo 1$ANSWER >/tmp/tinyfd.txt\';",0x22);
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"cat -v /tmp/tinyfd.txt",0x17);
              goto LAB_00112795;
            }
            iVar4 = gdialogPresent();
            if (iVar4 == 0) {
              iVar5 = xdialogPresent();
              if (iVar5 != 0) {
                if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0))
                {
                  uVar8 = 0x676f6c61696478;
                  goto LAB_00112570;
                }
                uVar8 = 0x676f6c6169645828;
                goto LAB_00112bc2;
              }
              pcVar7 = dialogName();
              if (pcVar7 == (char *)0x0) {
                iVar5 = isTerminalRunning();
                if (iVar5 != 0) {
                  if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)
                     ) {
                    builtin_strncpy(tinyfd_response,"whiptail",9);
                    return (char *)0x0;
                  }
                  builtin_strncpy(__dest,"(whiptail ",0xb);
                  goto LAB_0011315f;
                }
                if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0))
                {
                  builtin_strncpy(tinyfd_response,"whiptail",9);
                  return (char *)0x0;
                }
                pcVar7 = terminalName();
                strcpy(__dest,pcVar7);
                sVar6 = strlen(__dest);
                builtin_strncpy(__dest + sVar6,"\'(whiptail ",0xc);
LAB_001135d7:
                bVar1 = true;
                bVar2 = false;
              }
              else {
                if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0))
                {
                  builtin_strncpy(tinyfd_response,"dialog",7);
                  return (char *)0x0;
                }
                iVar5 = isTerminalRunning();
                if (iVar5 == 0) {
                  pcVar7 = terminalName();
                  strcpy(__dest,pcVar7);
                  sVar6 = strlen(__dest);
                  (__dest + sVar6)[0] = '\'';
                  (__dest + sVar6)[1] = '(';
                  __dest[sVar6 + 2] = '\0';
                  pcVar7 = dialogName();
                  strcat(__dest,pcVar7);
                  sVar6 = strlen(__dest);
                  (__dest + sVar6)[0] = ' ';
                  (__dest + sVar6)[1] = '\0';
                  goto LAB_001135d7;
                }
                builtin_strncpy(__dest,"(dialog ",9);
LAB_0011315f:
                bVar1 = true;
                bVar2 = true;
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar5 = strcmp(aTitle,"tinyfd_query"), iVar5 == 0)) {
                uVar8 = 0x676f6c61696467;
LAB_00112570:
                tinyfd_response._0_4_ = (undefined4)uVar8;
                tinyfd_response._4_2_ = (undefined2)((ulong)uVar8 >> 0x20);
                tinyfd_response[6] = (char)((ulong)uVar8 >> 0x30);
                tinyfd_response[7] = '\0';
                return (char *)0x1;
              }
              uVar8 = 0x676f6c6169646728;
LAB_00112bc2:
              *(undefined8 *)__dest = uVar8;
              __dest[8] = ' ';
              __dest[9] = '\0';
              bVar2 = true;
              bVar1 = false;
            }
            if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"--title \"",10);
              strcat(__dest,aTitle);
              sVar6 = strlen(__dest);
              (__dest + sVar6)[0] = '\"';
              (__dest + sVar6)[1] = ' ';
              __dest[sVar6 + 2] = '\0';
            }
            iVar5 = xdialogPresent();
            if ((iVar5 == 0) && (iVar5 = gdialogPresent(), iVar5 == 0)) {
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"--backtitle \"",0xe);
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"tab: move focus",0x10);
              if (aDefaultInput == (char *)0x0 && iVar4 == 0) {
                sVar6 = strlen(__dest);
                builtin_strncpy(__dest + sVar6,
                                " (sometimes nothing, no blink nor star, is shown in text field)",
                                0x40);
              }
              sVar6 = strlen(__dest);
              (__dest + sVar6)[0] = '\"';
              (__dest + sVar6)[1] = ' ';
              __dest[sVar6 + 2] = '\0';
            }
            if (aDefaultInput == (char *)0x0 && iVar4 == 0) {
              if (((bVar1) && (pcVar7 = dialogName(), pcVar7 != (char *)0x0)) &&
                 (iVar4 = isDialogVersionBetter09b(), iVar4 != 0)) {
                sVar6 = strlen(__dest);
                builtin_strncpy(__dest + sVar6,"--insecure ",0xc);
              }
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"--passwordbox",0xe);
            }
            else {
              sVar6 = strlen(__dest);
              builtin_strncpy(__dest + sVar6,"--inputbox",0xb);
            }
            sVar6 = strlen(__dest);
            (__dest + sVar6)[0] = ' ';
            (__dest + sVar6)[1] = '\"';
            __dest[sVar6 + 2] = '\0';
            if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
              strcat(__dest,aMessage);
            }
            sVar6 = strlen(__dest);
            builtin_strncpy(__dest + sVar6,"\" 10 60 ",9);
            if ((aDefaultInput != (char *)0x0) && (*aDefaultInput != '\0')) {
              sVar6 = strlen(__dest);
              (__dest + sVar6)[0] = '\"';
              (__dest + sVar6)[1] = '\0';
              strcat(__dest,aDefaultInput);
              sVar6 = strlen(__dest);
              (__dest + sVar6)[0] = '\"';
              (__dest + sVar6)[1] = ' ';
              __dest[sVar6 + 2] = '\0';
            }
            sVar6 = strlen(__dest);
            if (bVar1) {
              memcpy(__dest + sVar6,
                     ">/dev/tty ) 2>/tmp/tinyfd.txt;        if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;        tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
                     ,0x9f);
              sVar6 = strlen(__dest);
              if (bVar2) {
                builtin_strncpy(__dest + sVar6,"; clear >/dev/tty",0x12);
              }
              else {
                builtin_strncpy(__dest + sVar6," >/tmp/tinyfd0.txt\';cat /tmp/tinyfd0.txt",0x29);
              }
            }
            else {
              memcpy(__dest + sVar6,
                     ") 2>/tmp/tinyfd.txt;        if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;        tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
                     ,0x95);
            }
          }
        }
      }
      else {
        iVar4 = gxmessagePresent();
        if (iVar4 == 0) {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            builtin_strncpy(tinyfd_response,"gmessage",9);
            return (char *)0x1;
          }
          builtin_strncpy(__dest,"szAnswer=$(gmessage -buttons Ok:1,Cancel:0 -center \"",0x35);
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            builtin_strncpy(tinyfd_response,"gxmessage",10);
            return (char *)0x1;
          }
          builtin_strncpy(__dest,"szAnswer=$(gxmessage -buttons Ok:1,Cancel:0 -center \"",0x36);
        }
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          strcat(__dest,aMessage);
        }
        sVar6 = strlen(__dest);
        (__dest + sVar6)[0] = '\"';
        (__dest + sVar6)[1] = '\0';
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar6 = strlen(__dest);
          builtin_strncpy(__dest + sVar6," -title  \"",0xb);
          strcat(__dest,aTitle);
          sVar6 = strlen(__dest);
          (__dest + sVar6)[0] = '\"';
          (__dest + sVar6)[1] = ' ';
          __dest[sVar6 + 2] = '\0';
        }
        sVar6 = strlen(__dest);
        builtin_strncpy(__dest + sVar6," -entrytext \"",0xe);
        if ((aDefaultInput != (char *)0x0) && (*aDefaultInput != '\0')) {
          strcat(__dest,aDefaultInput);
        }
        sVar6 = strlen(__dest);
        (__dest + sVar6)[0] = '\"';
        (__dest + sVar6)[1] = '\0';
        sVar6 = strlen(__dest);
        builtin_strncpy(__dest + sVar6,");echo $?$szAnswer",0x13);
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
        uVar8 = 0x676f6c6169646b;
        goto LAB_00112570;
      }
      builtin_strncpy(__dest,"szAnswer=$(kdialog",0x13);
      iVar4 = kdialogPresent();
      if (iVar4 == 2) {
        sVar6 = strlen(__dest);
        memcpy(__dest + sVar6," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",
               0x41);
      }
      sVar6 = strlen(__dest);
      if (aDefaultInput == (char *)0x0) {
        builtin_strncpy(__dest + sVar6 + 5,"ssword ",8);
        uVar8 = 0x77737361702d2d20;
      }
      else {
        builtin_strncpy(__dest + sVar6 + 5,"putbox ",8);
        uVar8 = 0x7475706e692d2d20;
      }
      *(undefined8 *)(__dest + sVar6) = uVar8;
      sVar6 = strlen(__dest);
      (__dest + sVar6)[0] = '\"';
      (__dest + sVar6)[1] = '\0';
      if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
        strcat(__dest,aMessage);
      }
      sVar6 = strlen(__dest);
      builtin_strncpy(__dest + sVar6,"\" \"",4);
      if ((aDefaultInput != (char *)0x0) && (*aDefaultInput != '\0')) {
        strcat(__dest,aDefaultInput);
      }
      sVar6 = strlen(__dest);
      (__dest + sVar6)[0] = '\"';
      (__dest + sVar6)[1] = '\0';
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar6 = strlen(__dest);
        builtin_strncpy(__dest + sVar6," --title \"",0xb);
        strcat(__dest,aTitle);
        sVar6 = strlen(__dest);
        (__dest + sVar6)[0] = '\"';
        (__dest + sVar6)[1] = '\0';
      }
LAB_0011275b:
      sVar6 = strlen(__dest);
      builtin_strncpy(__dest + sVar6,");if [ $? = 0 ];then echo 1$szAnswer;else echo 0$szAnswer;fi",
                      0x3d);
    }
    bVar1 = true;
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return (char *)0x1;
    }
    builtin_strncpy(__dest,"osascript ",0xb);
    iVar4 = osx9orBetter();
    if (iVar4 == 0) {
      sVar6 = strlen(__dest);
      builtin_strncpy(__dest + sVar6," -e \'tell application \"System Events\"\' -e \'Activate\'",
                      0x35);
    }
    sVar6 = strlen(__dest);
    builtin_strncpy(__dest + sVar6," -e \'try\' -e \'display dialog \"",0x1f);
    if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
      strcat(__dest,aMessage);
    }
    sVar6 = strlen(__dest);
    __dest[sVar6 + 2] = '\0';
    (__dest + sVar6)[0] = '\"';
    (__dest + sVar6)[1] = ' ';
    sVar6 = strlen(__dest);
    builtin_strncpy(__dest + sVar6,"default answer \"",0x11);
    if (aDefaultInput == (char *)0x0) {
      sVar6 = strlen(__dest);
      (__dest + sVar6)[0] = '\"';
      (__dest + sVar6)[1] = ' ';
      __dest[sVar6 + 2] = '\0';
      sVar6 = strlen(__dest);
      builtin_strncpy(__dest + sVar6,"hidden answer true ",0x14);
    }
    else {
      if (*aDefaultInput != '\0') {
        strcat(__dest,aDefaultInput);
      }
      sVar6 = strlen(__dest);
      (__dest + sVar6)[0] = '\"';
      (__dest + sVar6)[1] = ' ';
      __dest[sVar6 + 2] = '\0';
    }
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar6 = strlen(__dest);
      builtin_strncpy(__dest + sVar6,"with title \"",0xd);
      strcat(__dest,aTitle);
      sVar6 = strlen(__dest);
      (__dest + sVar6)[0] = '\"';
      (__dest + sVar6)[1] = ' ';
      __dest[sVar6 + 2] = '\0';
    }
    sVar6 = strlen(__dest);
    builtin_strncpy(__dest + sVar6,"with icon note\' ",0x11);
    sVar6 = strlen(__dest);
    builtin_strncpy(__dest + sVar6,"-e \'\"1\" & text returned of result\' ",0x24);
    sVar6 = strlen(__dest);
    builtin_strncpy(__dest + sVar6,"-e \'on error number -128\' ",0x1b);
    sVar6 = strlen(__dest);
    builtin_strncpy(__dest + sVar6,"-e \'0\' ",8);
    sVar6 = strlen(__dest);
    builtin_strncpy(__dest + sVar6,"-e \'end try\'",0xd);
    iVar4 = osx9orBetter();
    bVar1 = true;
    if (iVar4 == 0) {
      sVar6 = strlen(__dest);
      builtin_strncpy(__dest + sVar6," -e \'end tell\'",0xf);
    }
  }
LAB_00112795:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",__dest);
  }
  __stream = popen(__dest,"r");
  if (__stream == (FILE *)0x0) {
    iVar4 = fileExists("/tmp/tinyfd.txt");
    if (iVar4 != 0) {
      wipefile("/tmp/tinyfd.txt");
      remove("/tmp/tinyfd.txt");
    }
    iVar4 = fileExists("/tmp/tinyfd0.txt");
    if (iVar4 != 0) {
      wipefile("/tmp/tinyfd0.txt");
      remove("/tmp/tinyfd0.txt");
    }
  }
  else {
    do {
      pcVar7 = fgets(tinyfd_inputBox::lBuff,0x400,__stream);
    } while (pcVar7 != (char *)0x0);
    pclose(__stream);
    iVar4 = fileExists("/tmp/tinyfd.txt");
    if (iVar4 != 0) {
      wipefile("/tmp/tinyfd.txt");
      remove("/tmp/tinyfd.txt");
    }
    iVar4 = fileExists("/tmp/tinyfd0.txt");
    if (iVar4 != 0) {
      wipefile("/tmp/tinyfd0.txt");
      remove("/tmp/tinyfd0.txt");
    }
    sVar6 = strlen(tinyfd_inputBox::lBuff);
    if (gPythonName[sVar6 + 0xf] == '\n') {
      gPythonName[sVar6 + 0xf] = '\0';
    }
    if ((bVar1) || (pcVar7 = strstr(tinyfd_inputBox::lBuff,"^["), pcVar7 == (char *)0x0)) {
      cVar3 = tinyfd_inputBox::lBuff[0];
      free(__dest);
      if (cVar3 != '1') {
        return (char *)0x0;
      }
      return tinyfd_inputBox::lBuff + 1;
    }
  }
LAB_001128e3:
  free(__dest);
  return (char *)0x0;
}

Assistant:

char const * tinyfd_inputBox(
        char const * const aTitle , /* NULL or "" */
        char const * const aMessage , /* NULL or "" may NOT contain \n nor \t */
        char const * const aDefaultInput ) /* "" , if NULL it's a passwordBox */
{
        static char lBuff [MAX_PATH_OR_CMD] ;
        char * lEOF;

#ifndef TINYFD_NOLIB
        DWORD mode = 0;
        HANDLE hStdin = GetStdHandle(STD_INPUT_HANDLE);

        if ((!tinyfd_forceConsole || !( 
                GetConsoleWindow() || 
                dialogPresent()))
                && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                lBuff[0]='\0';
                return inputBoxWinGui(lBuff, aTitle, aMessage, aDefaultInput);
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                lBuff[0]='\0';
                return inputBoxWinConsole(lBuff,aTitle,aMessage,aDefaultInput);
        }
        else 
        {
      if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
      lBuff[0]='\0';
      if (!gWarningDisplayed && !tinyfd_forceConsole)
      {
          gWarningDisplayed = 1 ;
          printf("\n\n%s\n", gTitle);
          printf("%s\n\n", tinyfd_needs);
      }
      if ( aTitle && strlen(aTitle) )
      {
          printf("\n%s\n\n", aTitle);
      }
      if ( aMessage && strlen(aMessage) )
      {
          printf("%s\n",aMessage);
      }
      printf("(ctrl-Z + enter to cancel): ");
#ifndef TINYFD_NOLIB
      if ( ! aDefaultInput )
      {
          GetConsoleMode(hStdin,&mode);
          SetConsoleMode(hStdin,mode & (~ENABLE_ECHO_INPUT) );
      }
#endif /* TINYFD_NOLIB */
      lEOF = fgets(lBuff, MAX_PATH_OR_CMD, stdin);
      if ( ! lEOF )
      {
          return NULL;
      }
#ifndef TINYFD_NOLIB
      if ( ! aDefaultInput )
      {
          SetConsoleMode(hStdin,mode);
          printf("\n");
      }
#endif /* TINYFD_NOLIB */
      printf("\n");
      if ( strchr(lBuff,27) )
      {
          return NULL ;
      }
      if ( lBuff[strlen( lBuff ) -1] == '\n' )
      {
          lBuff[strlen( lBuff ) -1] = '\0' ;
      }
      return lBuff ;
  }
}